

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86assembler.cpp
# Opt level: O2

Error __thiscall
asmjit::v1_14::x86::Assembler::align(Assembler *this,AlignMode alignMode,uint32_t alignment)

{
  Logger *pLVar1;
  uint8_t uVar2;
  Error EVar3;
  byte *pbVar4;
  uint uVar5;
  long lVar6;
  undefined1 *puVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  Error EStack_f0;
  FormatIndentationGroup local_dc;
  CodeWriter writer;
  undefined1 local_b8 [144];
  
  if ((this->super_BaseAssembler).super_BaseEmitter._code == (CodeHolder *)0x0) {
    EStack_f0 = 5;
  }
  else {
    if (alignMode < (kMaxValue|kData)) {
      if (alignment < 2) {
        return 0;
      }
      if ((alignment < 0x41) &&
         (uVar5 = alignment - (alignment >> 1 & 0x55555555),
         uVar5 = (uVar5 >> 2 & 0x33333333) + (uVar5 & 0x33333333),
         ((uVar5 >> 4) + uVar5 & 0xf0f0f0f) * 0x1010101 >> 0x18 < 2)) {
        writer._cursor = (this->super_BaseAssembler)._bufferPtr;
        lVar6 = (long)writer._cursor - (long)(this->super_BaseAssembler)._bufferData;
        uVar11 = (-(ulong)alignment & (ulong)alignment + 0xffffffff + lVar6) - lVar6;
        if ((int)uVar11 != 0) {
          EVar3 = CodeWriter::ensureSpace(&writer,&this->super_BaseAssembler,uVar11 & 0xffffffff);
          if (EVar3 != 0) {
            return EVar3;
          }
          if (alignMode == kData) {
            uVar2 = 0xcc;
          }
          else if (alignMode == kCode) {
            uVar2 = 0x90;
            if (((this->super_BaseAssembler).super_BaseEmitter._encodingOptions & kOptimizedAlign)
                != kNone) {
              do {
                uVar9 = (uint)uVar11;
                uVar5 = 9;
                if (uVar9 < 9) {
                  uVar5 = uVar9;
                }
                uVar8 = uVar9;
                if (8 < (uVar11 & 0xffffffff)) {
                  uVar8 = 9;
                }
                lVar6 = 0;
                do {
                  *writer._cursor = align::nopData[uVar5 - 1][lVar6];
                  writer._cursor = writer._cursor + 1;
                  lVar6 = lVar6 + 1;
                } while (uVar8 != (uint)lVar6);
                uVar11 = (ulong)(uVar9 - uVar5);
              } while (uVar9 - uVar5 != 0);
              uVar11 = 0;
            }
          }
          else {
            uVar2 = '\0';
          }
          while (iVar10 = (int)uVar11, uVar11 = (ulong)(iVar10 - 1), iVar10 != 0) {
            *writer._cursor = uVar2;
            writer._cursor = writer._cursor + 1;
          }
          CodeWriter::done(&writer,&this->super_BaseAssembler);
        }
        pLVar1 = (this->super_BaseAssembler).super_BaseEmitter._logger;
        if (pLVar1 == (Logger *)0x0) {
          return 0;
        }
        puVar7 = local_b8;
        writer._cursor = (uint8_t *)0x20;
        local_b8[0] = 0;
        local_dc = kCode;
        pbVar4 = Support::Array<unsigned_char,_4UL>::
                 operator[]<asmjit::v1_14::FormatIndentationGroup>
                           (&(pLVar1->_options)._indentation,&local_dc);
        String::_opChars((String *)&writer,kAppend,' ',(ulong)*pbVar4);
        String::_opFormat((String *)&writer,kAppend,"align %u\n",(ulong)alignment);
        pLVar1 = (this->super_BaseAssembler).super_BaseEmitter._logger;
        uVar11 = (ulong)writer._cursor & 0xff;
        if (uVar11 < 0x1f) {
          puVar7 = (undefined1 *)((long)&writer._cursor + 1);
        }
        else {
          uVar11 = 0;
        }
        (*pLVar1->_vptr_Logger[2])(pLVar1,puVar7,uVar11);
        String::reset((String *)&writer);
        return 0;
      }
    }
    EStack_f0 = 2;
  }
  EVar3 = BaseEmitter::reportError((BaseEmitter *)this,EStack_f0,(char *)0x0);
  return EVar3;
}

Assistant:

Error Assembler::align(AlignMode alignMode, uint32_t alignment) {
  if (ASMJIT_UNLIKELY(!_code))
    return reportError(DebugUtils::errored(kErrorNotInitialized));

  if (ASMJIT_UNLIKELY(uint32_t(alignMode) > uint32_t(AlignMode::kMaxValue)))
    return reportError(DebugUtils::errored(kErrorInvalidArgument));

  if (alignment <= 1)
    return kErrorOk;

  if (ASMJIT_UNLIKELY(!Support::isPowerOf2(alignment) || alignment > Globals::kMaxAlignment))
    return reportError(DebugUtils::errored(kErrorInvalidArgument));

  uint32_t i = uint32_t(Support::alignUpDiff<size_t>(offset(), alignment));
  if (i > 0) {
    CodeWriter writer(this);
    ASMJIT_PROPAGATE(writer.ensureSpace(this, i));

    uint8_t pattern = 0x00;
    switch (alignMode) {
      case AlignMode::kCode: {
        if (hasEncodingOption(EncodingOptions::kOptimizedAlign)) {
          // Intel 64 and IA-32 Architectures Software Developer's Manual - Volume 2B (NOP).
          enum { kMaxNopSize = 9 };

          static const uint8_t nopData[kMaxNopSize][kMaxNopSize] = {
            { 0x90 },
            { 0x66, 0x90 },
            { 0x0F, 0x1F, 0x00 },
            { 0x0F, 0x1F, 0x40, 0x00 },
            { 0x0F, 0x1F, 0x44, 0x00, 0x00 },
            { 0x66, 0x0F, 0x1F, 0x44, 0x00, 0x00 },
            { 0x0F, 0x1F, 0x80, 0x00, 0x00, 0x00, 0x00 },
            { 0x0F, 0x1F, 0x84, 0x00, 0x00, 0x00, 0x00, 0x00 },
            { 0x66, 0x0F, 0x1F, 0x84, 0x00, 0x00, 0x00, 0x00, 0x00 }
          };

          do {
            uint32_t n = Support::min<uint32_t>(i, kMaxNopSize);
            const uint8_t* src = nopData[n - 1];

            i -= n;
            do {
              writer.emit8(*src++);
            } while (--n);
          } while (i);
        }

        pattern = 0x90;
        break;
      }

      case AlignMode::kData:
        pattern = 0xCC;
        break;

      case AlignMode::kZero:
        // Pattern already set to zero.
        break;
    }

    while (i) {
      writer.emit8(pattern);
      i--;
    }

    writer.done(this);
  }

#ifndef ASMJIT_NO_LOGGING
  if (_logger) {
    StringTmp<128> sb;
    sb.appendChars(' ', _logger->indentation(FormatIndentationGroup::kCode));
    sb.appendFormat("align %u\n", alignment);
    _logger->log(sb);
  }
#endif

  return kErrorOk;
}